

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadEdif.c
# Opt level: O0

Abc_Ntk_t * Io_ReadEdif(char *pFileName,int fCheck)

{
  Abc_Ntk_t *pNtk;
  Extra_FileReader_t *p;
  int fCheck_local;
  char *pFileName_local;
  
  printf("Currently this parser does not work!\n");
  return (Abc_Ntk_t *)0x0;
}

Assistant:

Abc_Ntk_t * Io_ReadEdif( char * pFileName, int fCheck )
{
    Extra_FileReader_t * p;
    Abc_Ntk_t * pNtk;

    printf( "Currently this parser does not work!\n" );
    return NULL;

    // start the file
    p = Extra_FileReaderAlloc( pFileName, "#", "\n\r", " \t()" );
    if ( p == NULL )
        return NULL;

    // read the network
    pNtk = Io_ReadEdifNetwork( p );
    Extra_FileReaderFree( p );
    if ( pNtk == NULL )
        return NULL;

    // make sure that everything is okay with the network structure
    if ( fCheck && !Abc_NtkCheckRead( pNtk ) )
    {
        printf( "Io_ReadEdif: The network check has failed.\n" );
        Abc_NtkDelete( pNtk );
        return NULL;
    }
    return pNtk;
}